

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.h
# Opt level: O2

void __thiscall
Fixpp::Field<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>::Field
          (Field<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_> *this,
          Field<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_> *other)

{
  _Optional_payload_base<int> _Var1;
  bool bVar2;
  
  Type::UTCTimestamp::Time::Time(&this->val_);
  this->empty_ = false;
  bVar2 = other->empty_;
  if (bVar2 == false) {
    (this->val_).m_usec.super__Optional_base<int,_true,_true>._M_payload.
    super__Optional_payload_base<int> =
         (other->val_).m_usec.super__Optional_base<int,_true,_true>._M_payload.
         super__Optional_payload_base<int>;
    _Var1 = (other->val_).m_msec.super__Optional_base<int,_true,_true>._M_payload.
            super__Optional_payload_base<int>;
    (this->val_).m_time = (other->val_).m_time;
    (this->val_).m_msec.super__Optional_base<int,_true,_true>._M_payload.
    super__Optional_payload_base<int> = _Var1;
    bVar2 = other->empty_;
  }
  this->empty_ = bVar2;
  return;
}

Assistant:

Field(const Field& other)
        {
            operator=(other);
        }